

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButtonPrivate::popupTimerDone(QToolButtonPrivate *this)

{
  QWidget *parent;
  PositionFunction positionFunction;
  bool bVar1;
  bool bVar2;
  Orientation OVar3;
  QMenu *pQVar4;
  QObject **ppQVar5;
  QObject *pQVar6;
  QToolBar *this_00;
  QWidget *pQVar7;
  int i;
  ulong uVar8;
  long in_FS_OFFSET;
  code *pcVar9;
  undefined8 uVar10;
  QSize local_98;
  QPoint initialPos;
  undefined1 local_88 [16];
  QWeakPointer<QObject> local_78;
  QWeakPointer<QObject> local_68;
  undefined1 local_50 [8];
  QAction **ppQStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  QBasicTimer::stop();
  if (((this->field_0x2ec & 4) == 0) &&
     (((this->super_QAbstractButtonPrivate).field_0x28c & 0x10) == 0)) goto LAB_004786c1;
  this->field_0x2ec = this->field_0x2ec | 4;
  local_68.d = (Data *)0x0;
  local_68.value = (QObject *)0x0;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->menuAction);
  if (bVar1) {
    ppQVar5 = &(this->menuAction).wp.value;
LAB_00478333:
    pQVar6 = (QObject *)QAction::menu<QMenu*>((QAction *)*ppQVar5);
    QWeakPointer<QObject>::assign<QObject>(&local_68,pQVar6);
    bVar1 = false;
  }
  else {
    if ((this->defaultAction != (QAction *)0x0) &&
       (pQVar4 = QAction::menu<QMenu*>(this->defaultAction), pQVar4 != (QMenu *)0x0)) {
      ppQVar5 = (QObject **)&this->defaultAction;
      goto LAB_00478333;
    }
    pQVar6 = (QObject *)operator_new(0x28);
    QMenu::QMenu((QMenu *)pQVar6,parent);
    QWeakPointer<QObject>::assign<QObject>(&local_68,pQVar6);
    for (uVar8 = 0;
        uVar8 < (ulong)(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.size;
        uVar8 = uVar8 + 1) {
      QWidget::addAction((QWidget *)local_68.value,
                         (this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.ptr
                         [uVar8]);
    }
    bVar1 = true;
  }
  bVar2 = QAbstractButton::autoRepeat((QAbstractButton *)parent);
  this->field_0x2ec = this->field_0x2ec & 0xef | bVar2 << 4;
  QAbstractButton::setAutoRepeat((QAbstractButton *)parent,false);
  this_00 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>
                      (*(QObject **)
                        &(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x10);
  if (this_00 == (QToolBar *)0x0) {
    bVar2 = true;
  }
  else {
    OVar3 = QToolBar::orientation(this_00);
    bVar2 = OVar3 != Vertical;
  }
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QToolButton>::QPointer<void>((QPointer<QToolButton> *)&local_78,(QToolButton *)parent);
  QMenu::setNoReplayFor((QMenu *)local_68.value,parent);
  if (!bVar1) {
    if (((QWidgetData *)local_68.d == (QWidgetData *)0x0) ||
       (pQVar7 = (QWidget *)local_68.value, *(int *)((long)&(local_68.d)->field_0x0 + 4) == 0)) {
      pQVar7 = (QWidget *)0x0;
    }
    local_50 = (undefined1  [8])onMenuTriggered;
    ppQStack_48 = (QAction **)0x0;
    QObjectPrivate::connect<void(QMenu::*)(QAction*),void(QToolButtonPrivate::*)(QAction*)>
              ((Object *)(local_88 + 8),(offset_in_QMenu_to_subr)pQVar7,(Object *)QMenu::triggered,0
               ,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)(local_88 + 8));
  }
  if (((QWidgetData *)local_68.d == (QWidgetData *)0x0) ||
     (pQVar7 = (QWidget *)local_68.value, *(int *)((long)&(local_68.d)->field_0x0 + 4) == 0)) {
    pQVar7 = (QWidget *)0x0;
  }
  local_50 = (undefined1  [8])updateButtonDown;
  ppQStack_48 = (QAction **)0x0;
  pcVar9 = updateButtonDown;
  uVar10 = 0;
  QObjectPrivate::connect<void(QMenu::*)(),void(QToolButtonPrivate::*)()>
            ((Object *)local_88,(offset_in_QMenu_to_subr)pQVar7,(Object *)QMenu::aboutToHide,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)((long)local_68.value + 8) + 0x2f8),
             &parent->super_QObject);
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)((long)local_68.value + 8) + 0x308),
             (QObject *)this->defaultAction);
  QWidget::actions((QList<QAction_*> *)local_50,parent);
  QArrayDataPointer<QAction_*>::operator=
            (&(this->actionsCopy).d,(QArrayDataPointer<QAction_*> *)local_50);
  QArrayDataPointer<QAction_*>::~QArrayDataPointer((QArrayDataPointer<QAction_*> *)local_50);
  ppQStack_48 = (QAction **)CONCAT71(0xaaaaaaaaaaaaaa,bVar2);
  initialPos = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = (undefined1  [8])parent;
  local_98 = (QSize)(**(code **)(*(long *)&(local_68.value)->field_0x0 + 0x70))();
  initialPos = popupTimerDone::anon_class_16_2_6d8a6aca::operator()
                         ((anon_class_16_2_6d8a6aca *)local_50,&local_98);
  positionFunction.super__Function_base._M_functor._8_8_ = uVar10;
  positionFunction.super__Function_base._M_functor._M_unused._M_object = pcVar9;
  positionFunction.super__Function_base._M_manager = (_Manager_type)local_50;
  positionFunction._M_invoker = (_Invoker_type)ppQStack_48;
  QMenuPrivate::exec(*(QMenuPrivate **)((long)local_68.value + 8),&initialPos,(QAction *)0x0,
                     positionFunction);
  std::
  _Function_handler<QPoint_(const_QSize_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtoolbutton.cpp:781:29)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff48,(_Any_data *)&stack0xffffffffffffff48,
               __destroy_functor);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_78);
  if (bVar2) {
    if (((QWidgetData *)local_68.d == (QWidgetData *)0x0) ||
       (pQVar7 = (QWidget *)local_68.value, *(int *)((long)&(local_68.d)->field_0x0 + 4) == 0)) {
      pQVar7 = (QWidget *)0x0;
    }
    QObjectPrivate::disconnect<void(QMenu::*)(),void(QToolButtonPrivate::*)()>
              ((Object *)pQVar7,(offset_in_QMenu_to_subr)QMenu::aboutToHide,(Object *)0x0,
               (Function)this);
    if ((this->field_0x2ec & 4) != 0) {
      updateButtonDown(this);
    }
    if (bVar1) {
      if ((((QWidgetData *)local_68.d != (QWidgetData *)0x0) &&
          (*(int *)((long)&(local_68.d)->field_0x0 + 4) != 0)) &&
         ((QWidget *)local_68.value != (QWidget *)0x0)) {
        (**(code **)(*(long *)&(local_68.value)->field_0x0 + 0x20))();
      }
    }
    else {
      if (((QWidgetData *)local_68.d == (QWidgetData *)0x0) ||
         (pQVar7 = (QWidget *)local_68.value, *(int *)((long)&(local_68.d)->field_0x0 + 4) == 0)) {
        pQVar7 = (QWidget *)0x0;
      }
      QObjectPrivate::disconnect<void(QMenu::*)(QAction*),void(QToolButtonPrivate::*)(QAction*)>
                ((Object *)pQVar7,(offset_in_QMenu_to_subr)QMenu::triggered,(Object *)0x0,
                 (Function)this);
    }
    QList<QAction_*>::clear(&this->actionsCopy);
    if ((this->field_0x2ec & 0x10) != 0) {
      QAbstractButton::setAutoRepeat((QAbstractButton *)parent,true);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_78);
  QWeakPointer<QObject>::~QWeakPointer(&local_68);
LAB_004786c1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::popupTimerDone()
{
    Q_Q(QToolButton);
    popupTimer.stop();
    if (!menuButtonDown && !down)
        return;

    menuButtonDown = true;
    QPointer<QMenu> actualMenu;
    bool mustDeleteActualMenu = false;
    if (menuAction) {
        actualMenu = menuAction->menu();
    } else if (defaultAction && defaultAction->menu()) {
        actualMenu = defaultAction->menu();
    } else {
        actualMenu = new QMenu(q);
        mustDeleteActualMenu = true;
        for (int i = 0; i < actions.size(); i++)
            actualMenu->addAction(actions.at(i));
    }
    repeat = q->autoRepeat();
    q->setAutoRepeat(false);
    bool horizontal = true;
#if QT_CONFIG(toolbar)
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (tb && tb->orientation() == Qt::Vertical)
        horizontal = false;
#endif
    QPointer<QToolButton> that = q;
    actualMenu->setNoReplayFor(q);
    if (!mustDeleteActualMenu) { //only if action are not in this widget
        QObjectPrivate::connect(actualMenu, &QMenu::triggered,
                                this, &QToolButtonPrivate::onMenuTriggered);
    }
    QObjectPrivate::connect(actualMenu, &QMenu::aboutToHide,
                            this, &QToolButtonPrivate::updateButtonDown);
    actualMenu->d_func()->causedPopup.widget = q;
    actualMenu->d_func()->causedPopup.action = defaultAction;
    actionsCopy = q->actions(); //(the list of action may be modified in slots)

    // QTBUG-78966, Delay positioning until after aboutToShow().
    auto positionFunction = [q, horizontal](const QSize &sizeHint) {
        return positionMenu(q, horizontal, sizeHint); };
    const auto initialPos = positionFunction(actualMenu->sizeHint());
    actualMenu->d_func()->exec(initialPos, nullptr, positionFunction);

    if (!that)
        return;

    QObjectPrivate::disconnect(actualMenu, &QMenu::aboutToHide,
                               this, &QToolButtonPrivate::updateButtonDown);
    if (menuButtonDown) {
        // The menu was empty, it didn't actually show up, so it was never hidden either
        updateButtonDown();
    }

    if (mustDeleteActualMenu) {
        delete actualMenu;
    } else {
        QObjectPrivate::disconnect(actualMenu, &QMenu::triggered,
                                   this, &QToolButtonPrivate::onMenuTriggered);
    }

    actionsCopy.clear();

    if (repeat)
        q->setAutoRepeat(true);
}